

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetTooltipV(char *fmt,__va_list_tag *args)

{
  ImGuiContext *g;
  __va_list_tag *args_local;
  char *fmt_local;
  
  if ((GImGui->DragDropWithinSourceOrTarget & 1U) == 0) {
    BeginTooltipEx(0,true);
  }
  else {
    BeginTooltip();
  }
  TextV(fmt,args);
  EndTooltip();
  return;
}

Assistant:

void ImGui::SetTooltipV(const char* fmt, va_list args)
{
    ImGuiContext& g = *GImGui;
    if (g.DragDropWithinSourceOrTarget)
        BeginTooltip();
    else
        BeginTooltipEx(0, true);
    TextV(fmt, args);
    EndTooltip();
}